

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void __thiscall prevector_tests::PrevectorTestInt::test_method(PrevectorTestInt *this)

{
  long lVar1;
  realtype values_00;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint position;
  int iVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  EVP_PKEY_CTX *src;
  FastRandomContext *rng;
  int iVar10;
  Size s;
  EVP_PKEY_CTX *dst;
  int *v;
  undefined4 *puVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee8;
  allocator_type local_f9;
  int values [4];
  prevector_tester<8U,_int> test;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.super_BasicTestingSetup.
         m_rng;
  for (uVar7 = 0; (int)uVar7 != 0x40; uVar7 = (ulong)((int)uVar7 + 1)) {
    prevector_tester<8U,_int>::prevector_tester(&test,rng);
    for (iVar6 = 0; iVar6 != 0x800; iVar6 = iVar6 + 1) {
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,2)
      ;
      if (uVar8 == 0) {
        uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                          (&rng->super_RandomMixin<FastRandomContext>,
                           (int)((ulong)((long)test.real_vector.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)test.real_vector.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2) + 1);
        uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        values[0] = (int)uVar8;
        prevector_tester<8U,_int>::insert(&test,uVar4,values);
      }
      if (((long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        if (uVar8 == 1) {
          uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                            (&rng->super_RandomMixin<FastRandomContext>,
                             (uint)((ulong)((long)test.real_vector.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)test.real_vector.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
          prevector_tester<8U,_int>::erase(&test,uVar4);
        }
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar8 == 2) {
        uVar12 = (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        iVar5 = RandomMixin<FastRandomContext>::randrange<int>
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        iVar5 = iVar5 + (int)(uVar12 >> 2);
        iVar10 = 2;
        if (2 < iVar5) {
          iVar10 = iVar5;
        }
        s = iVar10 - 2;
        if (0x1f < iVar5) {
          s = 0x1e;
        }
        prevector_tester<8U,_int>::resize(&test,s);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar8 == 3) {
        uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                          (&rng->super_RandomMixin<FastRandomContext>,
                           (int)((ulong)((long)test.real_vector.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                        (long)test.real_vector.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start) >> 2) + 1);
        bVar3 = RandomMixin<FastRandomContext>::randbool(&rng->super_RandomMixin<FastRandomContext>)
        ;
        uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        values[0] = (int)uVar8;
        prevector_tester<8U,_int>::insert(&test,uVar4,bVar3 + 1,values);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar8 == 4) {
        uVar12 = (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        bVar3 = RandomMixin<FastRandomContext>::randbool(&rng->super_RandomMixin<FastRandomContext>)
        ;
        iVar5 = (int)(uVar12 >> 2);
        iVar10 = bVar3 + 1;
        if (iVar5 <= (int)(bVar3 + 1)) {
          iVar10 = iVar5;
        }
        uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                          (&rng->super_RandomMixin<FastRandomContext>,
                           ((int)((ulong)((long)test.real_vector.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)test.real_vector.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2) - iVar10) +
                           1);
        prevector_tester<8U,_int>::erase(&test,uVar4,iVar10 + uVar4);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,4)
      ;
      if (uVar8 == 5) {
        uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        values[0] = (int)uVar8;
        prevector_tester<8U,_int>::push_back(&test,values);
      }
      if (((long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,4);
        if (uVar8 == 6) {
          prevector_tester<8U,_int>::pop_back(&test);
        }
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar8 == 7) {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        uVar4 = (int)uVar8 + 1;
        uVar12 = 0;
        if (0 < (int)uVar4) {
          uVar12 = (ulong)uVar4;
        }
        for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
          uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                            (&rng->super_RandomMixin<FastRandomContext>);
          values[uVar13] = (int)uVar8;
        }
        position = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                             (&rng->super_RandomMixin<FastRandomContext>,
                              (int)((ulong)((long)test.real_vector.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)test.real_vector.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2) + 1
                             );
        prevector_tester<8u,int>::insert_range<int*>
                  ((prevector_tester<8u,int> *)&test,position,values,values + (int)uVar4);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar8 == 8) {
        uVar12 = (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        iVar5 = (int)uVar8 + 1;
        iVar10 = (int)(uVar12 >> 2);
        if (iVar5 < iVar10) {
          iVar10 = iVar5;
        }
        uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                          (&rng->super_RandomMixin<FastRandomContext>,
                           ((int)((ulong)((long)test.real_vector.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)test.real_vector.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2) - iVar10) +
                           1);
        prevector_tester<8U,_int>::erase(&test,uVar4,iVar10 + uVar4);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar8 == 9) {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        prevector_tester<8U,_int>::reserve(&test,(Size)uVar8);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,6)
      ;
      if (uVar8 == 10) {
        prevector_tester<8U,_int>::shrink_to_fit(&test);
      }
      uVar4 = (uint)((ulong)((long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)test.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      if (uVar4 != 0) {
        uVar4 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                          (&rng->super_RandomMixin<FastRandomContext>,uVar4);
        uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        values[0] = (int)uVar8;
        prevector_tester<8U,_int>::update(&test,uVar4,values);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits
                        (&rng->super_RandomMixin<FastRandomContext>,10);
      if (uVar8 == 0xb) {
        prevector_tester<8U,_int>::clear(&test);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,9)
      ;
      if (uVar8 == 0xc) {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        uVar9 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        values[0] = (int)uVar9;
        prevector_tester<8U,_int>::assign(&test,(Size)uVar8,values);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar8 == 3) {
        prevector_tester<8U,_int>::swap(&test);
      }
      dst = (EVP_PKEY_CTX *)0x4;
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,4)
      ;
      if (uVar8 == 8) {
        prevector_tester<8U,_int>::copy(&test,dst,src);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar8 == 0x12) {
        prevector_tester<8U,_int>::move(&test);
      }
      uVar8 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar8 == 0x13) {
        uVar8 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,4);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)values,(ulong)((int)uVar8 + 1),&local_f9);
        uVar2 = values._8_8_;
        for (puVar11 = (undefined4 *)CONCAT44(values[1],values[0]); puVar11 != (undefined4 *)uVar2;
            puVar11 = puVar11 + 1) {
          uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                            (&rng->super_RandomMixin<FastRandomContext>);
          *puVar11 = (int)uVar8;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffee8,
                   (vector<int,_std::allocator<int>_> *)values);
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = iVar6;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = in_stack_fffffffffffffed8;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uVar7;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = in_stack_fffffffffffffee8;
        prevector_tester<8U,_int>::resize_uninitialized(&test,values_00);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&stack0xfffffffffffffee8);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)values);
      }
    }
    prevector_tester<8U,_int>::~prevector_tester(&test);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(PrevectorTestInt)
{
    for (int j = 0; j < 64; j++) {
        prevector_tester<8, int> test{m_rng};
        for (int i = 0; i < 2048; i++) {
            if (m_rng.randbits(2) == 0) {
                test.insert(m_rng.randrange(test.size() + 1), int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(2) == 1) {
                test.erase(m_rng.randrange(test.size()));
            }
            if (m_rng.randbits(3) == 2) {
                int new_size = std::max(0, std::min(30, (int)test.size() + (int)m_rng.randrange(5) - 2));
                test.resize(new_size);
            }
            if (m_rng.randbits(3) == 3) {
                test.insert(m_rng.randrange(test.size() + 1), 1 + m_rng.randbool(), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 4) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbool()));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(4) == 5) {
                test.push_back(int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(4) == 6) {
                test.pop_back();
            }
            if (m_rng.randbits(5) == 7) {
                int values[4];
                int num = 1 + (m_rng.randbits(2));
                for (int k = 0; k < num; k++) {
                    values[k] = int(m_rng.rand32());
                }
                test.insert_range(m_rng.randrange(test.size() + 1), values, values + num);
            }
            if (m_rng.randbits(5) == 8) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbits(2)));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(5) == 9) {
                test.reserve(m_rng.randbits(5));
            }
            if (m_rng.randbits(6) == 10) {
                test.shrink_to_fit();
            }
            if (test.size() > 0) {
                test.update(m_rng.randrange(test.size()), int(m_rng.rand32()));
            }
            if (m_rng.randbits(10) == 11) {
                test.clear();
            }
            if (m_rng.randbits(9) == 12) {
                test.assign(m_rng.randbits(5), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 3) {
                test.swap();
            }
            if (m_rng.randbits(4) == 8) {
                test.copy();
            }
            if (m_rng.randbits(5) == 18) {
                test.move();
            }
            if (m_rng.randbits(5) == 19) {
                unsigned int num = 1 + (m_rng.randbits(4));
                std::vector<int> values(num);
                for (int& v : values) {
                    v = int(m_rng.rand32());
                }
                test.resize_uninitialized(values);
            }
        }
    }
}